

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void showMF(string *mySet,MultiFab *mf,string *name,int lev,int iter,int step)

{
  bool bVar1;
  size_type sVar2;
  Print *this;
  int in_ECX;
  string *in_RDX;
  int in_R8D;
  int in_R9D;
  string junkname;
  string DebugDir;
  Format saved_format;
  undefined1 in_stack_00000c43;
  How in_stack_00000c44;
  string *in_stack_00000c48;
  FabArray<amrex::FArrayBox> *in_stack_00000c50;
  undefined4 in_stack_fffffffffffffcd8;
  mode_t in_stack_fffffffffffffcdc;
  Print *in_stack_fffffffffffffce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  Print *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd18;
  Format in_stack_fffffffffffffd4c;
  Print *in_stack_fffffffffffffd50;
  string local_178 [32];
  string local_158 [8];
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  string *in_stack_fffffffffffffeb8;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  string local_48 [32];
  Format local_28;
  int local_24;
  int local_20;
  int local_1c;
  string *local_18;
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  sVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  if (sVar2 != 0) {
    local_28 = amrex::FArrayBox::getFormat();
    amrex::FArrayBox::setFormat(in_stack_fffffffffffffd4c);
    std::__cxx11::string::string(local_48,(string *)(anonymous_namespace)::ShowMF_Dir_abi_cxx11_);
    bVar1 = amrex::ParallelDescriptor::IOProcessor();
    if ((bVar1) &&
       (bVar1 = amrex::UtilCreateDirectory
                          ((string *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                           SUB41((uint)in_stack_fffffffffffffcd8 >> 0x18,0)), !bVar1)) {
      amrex::CreateDirectoryFailed(in_stack_fffffffffffffd18);
    }
    amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
    std::__cxx11::string::string(local_78,local_18);
    if (-1 < local_1c) {
      std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      amrex::Concatenate(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                         in_stack_fffffffffffffeb0);
      std::__cxx11::string::operator=(local_78,local_98);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
    }
    if (-1 < local_20) {
      std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      amrex::Concatenate(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                         in_stack_fffffffffffffeb0);
      std::__cxx11::string::operator=(local_78,local_d8);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_f8);
    }
    if (-1 < local_24) {
      std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      amrex::Concatenate(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                         in_stack_fffffffffffffeb0);
      std::__cxx11::string::operator=(local_78,local_118);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_138);
    }
    std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    std::operator+(in_stack_fffffffffffffce8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffce0);
    std::__cxx11::string::operator=(local_78,local_158);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_178);
    if (((anonymous_namespace)::ShowMF_Verbose & 1) != 0) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_fffffffffffffd10,(ostream *)in_stack_fffffffffffffd08);
      amrex::Print::operator<<
                (in_stack_fffffffffffffce0,
                 (char (*) [51])CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      this = amrex::Print::operator<<
                       (in_stack_fffffffffffffce0,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      amrex::Print::operator<<
                (this,(char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      amrex::Print::~Print(in_stack_fffffffffffffd50);
    }
    amrex::VisMF::Write(in_stack_00000c50,in_stack_00000c48,in_stack_00000c44,
                        (bool)in_stack_00000c43);
    amrex::FArrayBox::setFormat(in_stack_fffffffffffffd4c);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void
showMF(const std::string&   mySet,
       const MultiFab&      mf,
       const std::string&   name,
       int                  lev = -1,
       int                  iter = -1, // Default value = no append 2nd integer
       int                  step = -1) // Default value = no append 3nd integer
{
  if (ShowMF_Sets.count(mySet)>0)
  {
    const FABio::Format saved_format = FArrayBox::getFormat();
    FArrayBox::setFormat(ShowMF_Fab_Format);
    std::string DebugDir(ShowMF_Dir);
    if (ParallelDescriptor::IOProcessor())
      if (!amrex::UtilCreateDirectory(DebugDir, 0755))
        amrex::CreateDirectoryFailed(DebugDir);
    ParallelDescriptor::Barrier();

    std::string junkname = name;
    if (lev>=0) {
      junkname = amrex::Concatenate(junkname+"_",lev,1);
    }
    if (iter>=0) {
      junkname = amrex::Concatenate(junkname+"_",iter,1);
    }
    if (step>=0) {
      junkname = amrex::Concatenate(junkname+"_",step,5);
    }
    junkname = DebugDir + "/" + junkname;

    if (ShowMF_Verbose>0) {
      amrex::Print() << "   ******************************  Debug: writing "
             << junkname << '\n';
    }

#if 0
    if (ShowMF_Check_Nans)
    {
      for (MFIter mfi(mf); mfi.isValid(); ++mfi)
      {
        //                AMREX_ASSERT(!mf[mfi].contains_nan(mfi.validbox(),0,mf.nComp()));
      }
    }
#endif
    VisMF::Write(mf,junkname);
    FArrayBox::setFormat(saved_format);
  }
}